

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

void __thiscall leveldb::DBImpl::BackgroundCall(DBImpl *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 == 0) {
    if (this->background_compaction_scheduled_ == false) {
LAB_00cee5fd:
      __assert_fail("background_compaction_scheduled_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                    ,0x2a9,"void leveldb::DBImpl::BackgroundCall()");
    }
    if ((((this->shutting_down_)._M_base._M_i & 1U) == 0) &&
       ((this->bg_error_).state_ == (char *)0x0)) {
      BackgroundCompaction(this);
    }
    this->background_compaction_scheduled_ = false;
    MaybeScheduleCompaction(this);
    std::condition_variable::notify_all();
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__throw_system_error(iVar2);
    goto LAB_00cee5fd;
  }
  __stack_chk_fail();
}

Assistant:

void DBImpl::BackgroundCall() {
  MutexLock l(&mutex_);
  assert(background_compaction_scheduled_);
  if (shutting_down_.load(std::memory_order_acquire)) {
    // No more background work when shutting down.
  } else if (!bg_error_.ok()) {
    // No more background work after a background error.
  } else {
    BackgroundCompaction();
  }

  background_compaction_scheduled_ = false;

  // Previous compaction may have produced too many files in a level,
  // so reschedule another compaction if needed.
  MaybeScheduleCompaction();
  background_work_finished_signal_.SignalAll();
}